

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O1

void lj_trace_reenableproto(GCproto *pt)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  
  if ((pt->flags & 0x10) != 0) {
    uVar1 = pt->sizebc;
    pt->flags = pt->flags & 0xef;
    if ((char)pt[1].nextgc.gcptr32 == 'Z') {
      *(undefined1 *)&pt[1].nextgc.gcptr32 = 0x59;
    }
    if (1 < uVar1) {
      lVar2 = 0;
      do {
        uVar3 = (*(uint *)(&pt[1].marked + lVar2 * 4) & 0xff) - 0x50;
        if ((uVar3 < 7) && ((0x49U >> (uVar3 & 0x1f) & 1) != 0)) {
          (&pt[1].marked)[lVar2 * 4] = (char)*(uint *)(&pt[1].marked + lVar2 * 4) + 0xff;
        }
        lVar2 = lVar2 + 1;
      } while ((ulong)uVar1 - 1 != lVar2);
    }
  }
  return;
}

Assistant:

void lj_trace_reenableproto(GCproto *pt)
{
  if ((pt->flags & PROTO_ILOOP)) {
    BCIns *bc = proto_bc(pt);
    BCPos i, sizebc = pt->sizebc;
    pt->flags &= ~PROTO_ILOOP;
    if (bc_op(bc[0]) == BC_IFUNCF)
      setbc_op(&bc[0], BC_FUNCF);
    for (i = 1; i < sizebc; i++) {
      BCOp op = bc_op(bc[i]);
      if (op == BC_IFORL || op == BC_IITERL || op == BC_ILOOP)
	setbc_op(&bc[i], (int)op+(int)BC_LOOP-(int)BC_ILOOP);
    }
  }
}